

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_libapi.cpp
# Opt level: O0

ze_result_t zetMetricQueryReset(zet_metric_query_handle_t hMetricQuery)

{
  zet_pfnMetricQueryReset_t p_Var1;
  __pointer_type p_Var2;
  zet_pfnMetricQueryReset_t pfnReset;
  zet_metric_query_handle_t hMetricQuery_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zet_dditable_t_*>::load
                       ((atomic<_zet_dditable_t_*> *)(ze_lib::context + 0x18),memory_order_seq_cst);
    p_Var1 = (p_Var2->MetricQuery).pfnReset;
    if (p_Var1 == (zet_pfnMetricQueryReset_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hMetricQuery_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hMetricQuery_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hMetricQuery_local._4_4_ = (*p_Var1)(hMetricQuery);
    }
  }
  else {
    hMetricQuery_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hMetricQuery_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zetMetricQueryReset(
    zet_metric_query_handle_t hMetricQuery          ///< [in] handle of metric query
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zet_pfnMetricQueryReset_t pfnReset = [&result] {
        auto pfnReset = ze_lib::context->zetDdiTable.load()->MetricQuery.pfnReset;
        if( nullptr == pfnReset ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnReset;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnReset( hMetricQuery );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnReset = ze_lib::context->zetDdiTable.load()->MetricQuery.pfnReset;
    if( nullptr == pfnReset ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnReset( hMetricQuery );
    #endif
}